

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseFreeformGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  TreeModel *pTVar1;
  bool bVar2;
  uint uVar3;
  UINT32 UVar4;
  uint uVar5;
  uint uVar6;
  UINT8 *ffsSize;
  char *pcVar7;
  CBString local_220;
  UByteArray local_208;
  undefined1 auStack_1e8 [8];
  FREEFORM_GUIDED_SECTION_PARSING_DATA pdata_1;
  UByteArray local_1d0;
  CBString local_1b0;
  UModelIndex local_198;
  CBString local_180;
  CBString local_168;
  undefined1 local_150 [8];
  CBString info;
  undefined1 local_120 [8];
  CBString name;
  UByteArray body;
  UByteArray header;
  EFI_FREEFORM_SUBTYPE_GUID_SECTION *fsgSectionHeader_1;
  EFI_FREEFORM_SUBTYPE_GUID_SECTION *fsgSectionHeader;
  EFI_COMMON_SECTION_HEADER2 *section2Header;
  EFI_COMMON_SECTION_HEADER *sectionHeader;
  undefined1 auStack_a0 [7];
  UINT8 type;
  EFI_GUID guid;
  UINT32 headerSize;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  UModelIndex parentVolumeIndex;
  UINT8 ffsVersion;
  bool insertIntoTree_local;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *section_local;
  FfsParser *this_local;
  
  uVar3 = UByteArray::size(section);
  if (uVar3 < 4) {
    this_local = (FfsParser *)0x14;
  }
  else {
    parentVolumeIndex.m._6_1_ = '\x02';
    TreeModel::findParentOfType((UModelIndex *)((long)&data.d.field_2 + 8),this->model,parent,'A');
    bVar2 = UModelIndex::isValid((UModelIndex *)((long)&data.d.field_2 + 8));
    if ((bVar2) &&
       (bVar2 = TreeModel::hasEmptyParsingData
                          (this->model,(UModelIndex *)((long)&data.d.field_2 + 8)), !bVar2)) {
      TreeModel::parsingData
                ((UByteArray *)&pdata,this->model,(UModelIndex *)((long)&data.d.field_2 + 8));
      pcVar7 = UByteArray::constData((UByteArray *)&pdata);
      parentVolumeIndex.m._6_1_ = pcVar7[0x19];
      UByteArray::~UByteArray((UByteArray *)&pdata);
    }
    ffsSize = (UINT8 *)UByteArray::constData(section);
    pcVar7 = UByteArray::constData(section);
    if ((parentVolumeIndex.m._6_1_ == '\x03') &&
       (UVar4 = uint24ToUint32(ffsSize), UVar4 == 0xffffff)) {
      uVar3 = UByteArray::size(section);
      if (uVar3 < 0x18) {
        return 0x14;
      }
      guid.Data4[0] = '\x18';
      guid.Data4[1] = '\0';
      guid.Data4[2] = '\0';
      guid.Data4[3] = '\0';
      _auStack_a0 = *(undefined8 *)(pcVar7 + 8);
      guid._0_8_ = *(undefined8 *)(pcVar7 + 0x10);
      sectionHeader._7_1_ = pcVar7[3];
    }
    else {
      guid.Data4[0] = '\x14';
      guid.Data4[1] = '\0';
      guid.Data4[2] = '\0';
      guid.Data4[3] = '\0';
      _auStack_a0 = *(undefined8 *)(ffsSize + 4);
      guid._0_8_ = *(undefined8 *)(ffsSize + 0xc);
      sectionHeader._7_1_ = ffsSize[3];
    }
    uVar3 = UByteArray::size(section);
    if (uVar3 < (uint)guid.Data4._0_4_) {
      this_local = (FfsParser *)0x14;
    }
    else {
      UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),section,guid.Data4._0_4_);
      UByteArray::mid((UByteArray *)&name.super_tagbstring.data,section,guid.Data4._0_4_,-1);
      sectionTypeToUString((CBString *)&info.super_tagbstring.data,sectionHeader._7_1_);
      Bstrlib::CBString::operator+
                ((CBString *)local_120,(CBString *)&info.super_tagbstring.data," section");
      Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
      uVar3 = UByteArray::size(section);
      uVar5 = UByteArray::size(section);
      uVar6 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      usprintf(&local_168,
               "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: "
               ,(ulong)sectionHeader._7_1_,(ulong)uVar3,(ulong)uVar5,(ulong)uVar6);
      guidToUString(&local_180,(EFI_GUID *)auStack_a0,false);
      Bstrlib::CBString::operator+((CBString *)local_150,&local_168,&local_180);
      Bstrlib::CBString::~CBString(&local_180);
      Bstrlib::CBString::~CBString(&local_168);
      if (insertIntoTree) {
        pTVar1 = this->model;
        Bstrlib::CBString::CBString(&local_1b0);
        UByteArray::UByteArray(&local_1d0);
        TreeModel::addItem(&local_198,pTVar1,localOffset,'C',sectionHeader._7_1_,
                           (CBString *)local_120,&local_1b0,(CBString *)local_150,
                           (UByteArray *)((long)&body.d.field_2 + 8),
                           (UByteArray *)&name.super_tagbstring.data,&local_1d0,Movable,parent,'\0')
        ;
        index->m = local_198.m;
        index->r = local_198.r;
        index->c = local_198.c;
        index->i = local_198.i;
        UByteArray::~UByteArray(&local_1d0);
        Bstrlib::CBString::~CBString(&local_1b0);
        auStack_1e8._0_4_ = auStack_a0._0_4_;
        auStack_1e8._4_2_ = auStack_a0._4_2_;
        auStack_1e8._6_2_ = stack0xffffffffffffff66;
        pdata_1.guid.Data1 = guid.Data1;
        pdata_1.guid.Data2 = guid.Data2;
        pdata_1.guid.Data3 = guid.Data3;
        pTVar1 = this->model;
        UByteArray::UByteArray(&local_208,auStack_1e8,0x10);
        TreeModel::setParsingData(pTVar1,index,&local_208);
        UByteArray::~UByteArray(&local_208);
        pTVar1 = this->model;
        guidToUString(&local_220,(EFI_GUID *)auStack_a0,true);
        TreeModel::setName(pTVar1,index,&local_220);
        Bstrlib::CBString::~CBString(&local_220);
      }
      this_local = (FfsParser *)0x0;
      Bstrlib::CBString::~CBString((CBString *)local_150);
      Bstrlib::CBString::~CBString((CBString *)local_120);
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
    }
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseFreeformGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = section2Header->Type;
    }
    else { // Normal section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: ",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size())
    + guidToUString(guid, false);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        FREEFORM_GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Rename section
        model->setName(index, guidToUString(guid));
    }
    
    return U_SUCCESS;
}